

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

MemberSyntax * __thiscall
slang::parsing::Parser::parseModule
          (Parser *this,AttrList attributes,SyntaxKind parentKind,bool *anyLocalModules)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  undefined4 uVar3;
  pointer puVar4;
  size_type sVar5;
  group_type_pointer pgVar6;
  value_type_pointer pbVar7;
  SyntaxNode *pSVar8;
  value_type_pointer ppVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  uint uVar14;
  bool bVar12;
  bool bVar13;
  TokenKind kind;
  SyntaxKind kind_00;
  int iVar15;
  AnonymousProgramSyntax *pAVar16;
  ModuleHeaderSyntax *pMVar17;
  Token *hash;
  Diagnostic *this_00;
  SourceLocation SVar18;
  undefined4 extraout_var;
  NamedBlockClauseSyntax *endBlock;
  ModuleDeclarationSyntax *pMVar19;
  byte bVar20;
  ulong uVar21;
  BumpAllocator *dst;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  TokenKind kind_01;
  Token *pTVar26;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *this_01;
  byte bVar27;
  ulong uVar28;
  bool bVar29;
  uchar uVar30;
  uchar uVar32;
  uchar uVar33;
  byte bVar34;
  undefined1 auVar31 [16];
  uchar uVar36;
  uchar uVar37;
  uchar uVar38;
  uchar uVar39;
  uchar uVar40;
  uchar uVar41;
  byte bVar42;
  uchar uVar43;
  uchar uVar44;
  uchar uVar45;
  byte bVar46;
  undefined1 auVar35 [16];
  Token TVar47;
  SourceRange range;
  string_view arg;
  bool anyLocalModules_1;
  _Storage<slang::TimeScale,_true> local_168;
  bool local_164;
  ulong local_160;
  Token *local_158;
  MemberSyntax *member;
  ulong local_148;
  Token *local_140;
  ModuleHeaderSyntax *local_138;
  Preprocessor *local_130;
  undefined1 local_128 [16];
  group_type_pointer local_118;
  ulong local_110;
  ulong local_108;
  pointer local_100;
  size_t local_f8;
  string_view name;
  Token endmodule;
  SmallVector<slang::syntax::MemberSyntax_*,_8UL> members;
  
  bVar12 = ParserBase::peek(&this->super_ParserBase,ProgramKeyword);
  if ((bVar12) && (TVar47 = ParserBase::peek(&this->super_ParserBase,1), TVar47.kind == Semicolon))
  {
    pAVar16 = parseAnonymousProgram(this,attributes);
    return &pAVar16->super_MemberSyntax;
  }
  local_130 = (this->super_ParserBase).window.tokenSource;
  local_130->designElementDepth = local_130->designElementDepth + 1;
  local_100 = attributes._M_ptr;
  local_f8 = attributes._M_extent._M_extent_value._M_extent_value;
  pMVar17 = parseModuleHeader(this);
  kind = syntax::SyntaxFacts::getModuleEndKind((pMVar17->moduleKeyword).kind);
  local_138 = pMVar17;
  if ((parentKind != CompilationUnit) && (name = Token::valueText(&pMVar17->name), name._M_len != 0)
     ) {
    if (*anyLocalModules == false) {
      SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      ::emplace_back<>(&(this->moduleDeclStack).
                        super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                      );
      *anyLocalModules = true;
    }
    puVar4 = (this->moduleDeclStack).
             super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
             .data_;
    sVar5 = (this->moduleDeclStack).
            super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            .len;
    pTVar26 = (Token *)(puVar4 + sVar5);
    this_01 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
              (puVar4 + (sVar5 - 1));
    hash = (Token *)hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                              (this_01,&name);
    uVar21 = (ulong)hash >> ((byte)*this_01 & 0x3f);
    lVar23 = ((ulong)hash & 0xff) * 4;
    uVar30 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             match_word(unsigned_long)::word[lVar23 + 0xc];
    uVar32 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             match_word(unsigned_long)::word[lVar23 + 0xd];
    uVar33 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             match_word(unsigned_long)::word[lVar23 + 0xe];
    bVar27 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             match_word(unsigned_long)::word[lVar23 + 0xf];
    uVar28 = (ulong)((uint)hash & 7);
    uVar22 = 0;
    uVar24 = uVar21;
    uVar36 = uVar30;
    uVar37 = uVar32;
    uVar38 = uVar33;
    bVar34 = bVar27;
    uVar39 = uVar30;
    uVar40 = uVar32;
    uVar41 = uVar33;
    bVar42 = bVar27;
    uVar43 = uVar30;
    uVar44 = uVar32;
    uVar45 = uVar33;
    bVar46 = bVar27;
    do {
      pgVar6 = (((pointer)((long)pTVar26 + -0x30))->table_).
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
               .arrays.groups_;
      pgVar1 = pgVar6 + uVar24;
      bVar20 = pgVar1->m[0xf].n;
      auVar31[0] = -(pgVar1->m[0].n == uVar30);
      auVar31[1] = -(pgVar1->m[1].n == uVar32);
      auVar31[2] = -(pgVar1->m[2].n == uVar33);
      auVar31[3] = -(pgVar1->m[3].n == bVar27);
      auVar31[4] = -(pgVar1->m[4].n == uVar36);
      auVar31[5] = -(pgVar1->m[5].n == uVar37);
      auVar31[6] = -(pgVar1->m[6].n == uVar38);
      auVar31[7] = -(pgVar1->m[7].n == bVar34);
      auVar31[8] = -(pgVar1->m[8].n == uVar39);
      auVar31[9] = -(pgVar1->m[9].n == uVar40);
      auVar31[10] = -(pgVar1->m[10].n == uVar41);
      auVar31[0xb] = -(pgVar1->m[0xb].n == bVar42);
      auVar31[0xc] = -(pgVar1->m[0xc].n == uVar43);
      auVar31[0xd] = -(pgVar1->m[0xd].n == uVar44);
      auVar31[0xe] = -(pgVar1->m[0xe].n == uVar45);
      auVar31[0xf] = -(bVar20 == bVar46);
      uVar14 = (uint)(ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe);
      if (uVar14 != 0) {
        local_128[1] = uVar32;
        local_128[0] = uVar30;
        local_128[2] = uVar33;
        local_128[3] = bVar27;
        local_128[4] = uVar36;
        local_128[5] = uVar37;
        local_128[6] = uVar38;
        local_128[7] = bVar34;
        local_128[8] = uVar39;
        local_128[9] = uVar40;
        local_128[10] = uVar41;
        local_128[0xb] = bVar42;
        local_128[0xc] = uVar43;
        local_128[0xd] = uVar44;
        local_128[0xe] = uVar45;
        local_128[0xf] = bVar46;
        local_118 = pgVar6 + uVar24;
        pbVar7 = (((pointer)((long)pTVar26 + -0x30))->table_).
                 super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                 .arrays.elements_;
        local_160 = uVar28;
        local_158 = pTVar26;
        local_148 = uVar22;
        local_140 = hash;
        local_110 = uVar21;
        local_108 = uVar24;
        do {
          iVar15 = 0;
          if (uVar14 != 0) {
            for (; (uVar14 >> iVar15 & 1) == 0; iVar15 = iVar15 + 1) {
            }
          }
          bVar12 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                             ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                              this_01,&name,
                              (basic_string_view<char,_std::char_traits<char>_> *)
                              ((long)&pbVar7[uVar24 * 0xf]._M_len + (ulong)(uint)(iVar15 << 4)));
          if (bVar12) goto LAB_001bc4c4;
          uVar14 = uVar14 - 1 & uVar14;
        } while (uVar14 != 0);
        bVar20 = local_118->m[0xf].n;
        hash = local_140;
        uVar21 = local_110;
        uVar28 = local_160;
        uVar22 = local_148;
        uVar24 = local_108;
        pTVar26 = local_158;
        uVar30 = local_128[0];
        uVar32 = local_128[1];
        uVar33 = local_128[2];
        bVar27 = local_128[3];
        uVar36 = local_128[4];
        uVar37 = local_128[5];
        uVar38 = local_128[6];
        bVar34 = local_128[7];
        uVar39 = local_128[8];
        uVar40 = local_128[9];
        uVar41 = local_128[10];
        bVar42 = local_128[0xb];
        uVar43 = local_128[0xc];
        uVar44 = local_128[0xd];
        uVar45 = local_128[0xe];
        bVar46 = local_128[0xf];
      }
      if ((*(byte *)((long)&boost::unordered::detail::foa::
                            group15<boost::unordered::detail::foa::plain_integral>::
                            is_not_overflowed(unsigned_long)::shift + uVar28) & bVar20) == 0) break;
      uVar25 = (((pointer)((long)pTVar26 + -0x30))->table_).
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
               .arrays.groups_size_mask;
      lVar23 = uVar24 + uVar22;
      uVar22 = uVar22 + 1;
      uVar24 = lVar23 + 1U & uVar25;
    } while (uVar22 <= uVar25);
    if ((((pointer)((long)pTVar26 + -0x30))->table_).
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
        .size_ctrl.size <
        (((pointer)((long)pTVar26 + -0x30))->table_).
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>&>
                ((locator *)&members,
                 (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)this_01,uVar21,(size_t)hash,&name);
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>&>
                ((locator *)&members,
                 (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)this_01,(size_t)hash,&name);
    }
  }
LAB_001bc4c4:
  kind_00 = syntax::SyntaxFacts::getModuleDeclarationKind((local_138->moduleKeyword).kind);
  uVar14._0_2_ = local_130->defaultNetType;
  uVar14._2_2_ = local_130->unconnectedDrive;
  local_128 = ZEXT416(uVar14);
  local_160 = CONCAT71(local_160._1_7_,local_130->cellDefine);
  local_164 = (local_130->activeTimeScale).super__Optional_base<slang::TimeScale,_true,_true>.
              _M_payload.super__Optional_payload_base<slang::TimeScale>._M_engaged;
  local_168 = (local_130->activeTimeScale).super__Optional_base<slang::TimeScale,_true,_true>.
              _M_payload.super__Optional_payload_base<slang::TimeScale>._M_payload;
  local_148 = CONCAT44(local_148._4_4_,this->currentDefinitionKind);
  this->currentDefinitionKind = kind_00;
  Token::Token(&endmodule);
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
       (pointer)members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement;
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len = 0;
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap = 8;
  anyLocalModules_1 = false;
  local_158 = &(this->super_ParserBase).lastPoppedDelims.first;
  local_140 = &(this->super_ParserBase).lastPoppedDelims.second;
  bVar12 = false;
  while( true ) {
    TVar47 = ParserBase::peek(&this->super_ParserBase);
    kind_01 = TVar47.kind;
    if ((kind_01 == EndOfFile) || (kind == kind_01)) break;
    member = parseMember(this,kind_00,&anyLocalModules_1);
    bVar29 = member == (MemberSyntax *)0x0;
    if (bVar29) {
      bVar13 = syntax::SyntaxFacts::isCloseDelimOrKeyword(kind_01);
      if (bVar13) {
        name = (string_view)ParserBase::peek(&this->super_ParserBase);
        range = Token::range((Token *)&name);
        this_00 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xb80005,range);
        name = (string_view)ParserBase::peek(&this->super_ParserBase);
        arg = Token::valueText((Token *)&name);
        Diagnostic::operator<<(this_00,arg);
        bVar27 = 0;
        if (((this->super_ParserBase).lastPoppedDelims.first.info != (Info *)0x0) &&
           (bVar27 = 0, (this->super_ParserBase).lastPoppedDelims.second.info != (Info *)0x0)) {
          SVar18 = Token::location(local_158);
          Diagnostic::addNote(this_00,(DiagCode)0xc10005,SVar18);
          SVar18 = Token::location(local_140);
          Diagnostic::addNote(this_00,(DiagCode)0xc00005,SVar18);
          bVar27 = 0;
        }
      }
      else {
        bVar27 = ~bVar12 & 1;
      }
      ParserBase::skipToken
                (&this->super_ParserBase,
                 (optional<slang::DiagCode>)((uint6)bVar27 << 0x20 | 0x450005));
      bVar12 = bVar29;
    }
    else {
      checkMemberAllowed(this,&member->super_SyntaxNode,kind_00);
      SmallVectorBase<slang::syntax::MemberSyntax*>::
      emplace_back<slang::syntax::MemberSyntax*const&>
                ((SmallVectorBase<slang::syntax::MemberSyntax*> *)&members,&member);
      pSVar8 = this->previewNode;
      this->previewNode = (SyntaxNode *)0x0;
      (member->super_SyntaxNode).previewNode = pSVar8;
      bVar12 = bVar29;
    }
  }
  if (anyLocalModules_1 == true) {
    SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::pop_back(&(this->moduleDeclStack).
                super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              );
  }
  endmodule = ParserBase::expect(&this->super_ParserBase,kind);
  dst = (this->super_ParserBase).alloc;
  iVar15 = SmallVectorBase<slang::syntax::MemberSyntax_*>::copy
                     (&members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>,
                      (EVP_PKEY_CTX *)dst,(EVP_PKEY_CTX *)endmodule.info);
  local_158 = (Token *)CONCAT44(extraout_var,iVar15);
  SmallVectorBase<slang::syntax::MemberSyntax_*>::cleanup
            (&members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>,(EVP_PKEY_CTX *)dst);
  this->currentDefinitionKind = (SyntaxKind)local_148;
  local_130->designElementDepth = local_130->designElementDepth + -1;
  endBlock = parseNamedBlockClause(this);
  pMVar17 = local_138;
  TVar47.kind = (local_138->name).kind;
  TVar47._2_1_ = (local_138->name).field_0x2;
  TVar47.numFlags.raw = (local_138->name).numFlags.raw;
  TVar47.rawLen = (local_138->name).rawLen;
  TVar47.info = (local_138->name).info;
  checkBlockNames(this,TVar47,endBlock);
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len =
       CONCAT44(members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len._4_4_,1);
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap = 0;
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[0] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[1] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[2] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[3] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[4] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[5] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[6] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[7] = '\0';
  members.stackBase[0] = (undefined1)local_f8;
  members.stackBase[1] = local_f8._1_1_;
  members.stackBase[2] = local_f8._2_1_;
  members.stackBase[3] = local_f8._3_1_;
  members.stackBase[4] = local_f8._4_1_;
  members.stackBase[5] = local_f8._5_1_;
  members.stackBase[6] = local_f8._6_1_;
  members.stackBase[7] = local_f8._7_1_;
  members.stackBase._8_8_ = local_100;
  members.stackBase[0x10] = (undefined1)local_f8;
  members.stackBase[0x11] = local_f8._1_1_;
  members.stackBase[0x12] = local_f8._2_1_;
  members.stackBase[0x13] = local_f8._3_1_;
  members.stackBase[0x14] = local_f8._4_1_;
  members.stackBase[0x15] = local_f8._5_1_;
  members.stackBase[0x16] = local_f8._6_1_;
  members.stackBase[0x17] = local_f8._7_1_;
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
       (pointer)&PTR_getChild_002da628;
  name._M_str._0_4_ = 1;
  name._M_len = (size_t)&PTR_getChild_002da718;
  pMVar19 = syntax::SyntaxFactory::moduleDeclaration
                      (&this->factory,kind_00,
                       (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&members,pMVar17,
                       (SyntaxList<slang::syntax::MemberSyntax> *)&name,endmodule,endBlock);
  name._M_len = (size_t)pMVar19;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = pMVar19;
  uVar25 = SUB168(auVar11 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar11 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar22 = uVar25 >> ((byte)(this->meta).nodeMap.table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
                            .arrays.groups_size_index & 0x3f);
  uVar3 = *(undefined4 *)
           (boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word + (uVar25 & 0xff) * 4);
  ppVar9 = (this->meta).nodeMap.table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
           .arrays.elements_;
  uVar21 = (this->meta).nodeMap.table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
           .arrays.groups_size_mask;
  uVar24 = 0;
  uVar28 = uVar22;
  do {
    pgVar2 = (this->meta).nodeMap.table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
             .arrays.groups_ + uVar28;
    bVar27 = pgVar2->m[0xf].n;
    uVar30 = (uchar)uVar3;
    auVar35[0] = -(pgVar2->m[0].n == uVar30);
    uVar32 = (uchar)((uint)uVar3 >> 8);
    auVar35[1] = -(pgVar2->m[1].n == uVar32);
    uVar33 = (uchar)((uint)uVar3 >> 0x10);
    auVar35[2] = -(pgVar2->m[2].n == uVar33);
    bVar34 = (byte)((uint)uVar3 >> 0x18);
    auVar35[3] = -(pgVar2->m[3].n == bVar34);
    auVar35[4] = -(pgVar2->m[4].n == uVar30);
    auVar35[5] = -(pgVar2->m[5].n == uVar32);
    auVar35[6] = -(pgVar2->m[6].n == uVar33);
    auVar35[7] = -(pgVar2->m[7].n == bVar34);
    auVar35[8] = -(pgVar2->m[8].n == uVar30);
    auVar35[9] = -(pgVar2->m[9].n == uVar32);
    auVar35[10] = -(pgVar2->m[10].n == uVar33);
    auVar35[0xb] = -(pgVar2->m[0xb].n == bVar34);
    auVar35[0xc] = -(pgVar2->m[0xc].n == uVar30);
    auVar35[0xd] = -(pgVar2->m[0xd].n == uVar32);
    auVar35[0xe] = -(pgVar2->m[0xe].n == uVar33);
    auVar35[0xf] = -(bVar27 == bVar34);
    for (uVar14 = (uint)(ushort)((ushort)(SUB161(auVar35 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe); uVar14 != 0;
        uVar14 = uVar14 - 1 & uVar14) {
      uVar10 = 0;
      if (uVar14 != 0) {
        for (; (uVar14 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
        }
      }
      if (pMVar19 == (ModuleDeclarationSyntax *)ppVar9[uVar28 * 0xf + (ulong)uVar10].first) {
        members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap =
             (size_type)(ppVar9 + uVar28 * 0xf + (ulong)uVar10);
        goto LAB_001bc8f8;
      }
    }
    if ((*(byte *)((long)&boost::unordered::detail::foa::
                          group15<boost::unordered::detail::foa::plain_integral>::
                          is_not_overflowed(unsigned_long)::shift + (ulong)((uint)uVar25 & 7)) &
        bVar27) == 0) break;
    lVar23 = uVar28 + uVar24;
    uVar24 = uVar24 + 1;
    uVar28 = lVar23 + 1U & uVar21;
  } while (uVar24 <= uVar21);
  if ((this->meta).nodeMap.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
      .size_ctrl.size <
      (this->meta).nodeMap.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::parsing::ParserMetadata::Node>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
              ((locator *)&members,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::parsing::ParserMetadata::Node>>>
                *)&this->meta,uVar22,uVar25,(try_emplace_args_t *)&member,(SyntaxNode **)&name);
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::parsing::ParserMetadata::Node>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
              ((locator *)&members,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::parsing::ParserMetadata::Node>>>
                *)&this->meta,uVar25,(try_emplace_args_t *)&member,(SyntaxNode **)&name);
  }
LAB_001bc8f8:
  (((value_type_pointer)members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap)->second).
  defaultNetType = local_128._0_2_;
  (((value_type_pointer)members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap)->second).
  unconnectedDrive = local_128._2_2_;
  (((value_type_pointer)members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap)->second).
  cellDefine = local_160._0_1_;
  (((value_type_pointer)members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap)->second).
  timeScale.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
  super__Optional_payload_base<slang::TimeScale>._M_payload = local_168;
  (((value_type_pointer)members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap)->second).
  timeScale.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
  super__Optional_payload_base<slang::TimeScale>._M_engaged = local_164;
  return &pMVar19->super_MemberSyntax;
}

Assistant:

MemberSyntax& Parser::parseModule(AttrList attributes, SyntaxKind parentKind,
                                  bool& anyLocalModules) {
    if (peek(TokenKind::ProgramKeyword) && peek(1).kind == TokenKind::Semicolon)
        return parseAnonymousProgram(attributes);

    // Tell the preprocessor that we're inside a design element for the duration of this function.
    auto& pp = getPP();
    pp.pushDesignElementStack();

    auto& header = parseModuleHeader();
    auto endKind = getModuleEndKind(header.moduleKeyword.kind);

    // If the parent isn't a compilation unit, that means we're a nested definition.
    // Record our name in the decl stack so that child instantiations know they're
    // referencing a local module and not a global one.
    if (parentKind != SyntaxKind::CompilationUnit) {
        auto name = header.name.valueText();
        if (!name.empty()) {
            if (!anyLocalModules) {
                moduleDeclStack.emplace_back();
                anyLocalModules = true;
            }
            moduleDeclStack.back().emplace(name);
        }
    }

    SyntaxKind declKind = getModuleDeclarationKind(header.moduleKeyword.kind);
    ParserMetadata::Node node{pp.getDefaultNetType(), pp.getUnconnectedDrive(), pp.getCellDefine(),
                              pp.getTimeScale()};

    auto savedDefinitionKind = currentDefinitionKind;
    currentDefinitionKind = declKind;

    Token endmodule;
    auto members = parseMemberList<MemberSyntax>(
        endKind, endmodule, declKind, [this](SyntaxKind parentKind, bool& anyLocalModules) {
            return parseMember(parentKind, anyLocalModules);
        });

    currentDefinitionKind = savedDefinitionKind;
    pp.popDesignElementStack();

    auto endName = parseNamedBlockClause();
    checkBlockNames(header.name, endName);

    auto& result = factory.moduleDeclaration(declKind, attributes, header, members, endmodule,
                                             endName);

    meta.nodeMap[&result] = node;
    return result;
}